

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O3

ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
* getMemoryBufferForStream
            (ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
             *__return_storage_ptr__,int FD,Twine *BufferName)

{
  int iVar1;
  int *piVar2;
  ssize_t sVar3;
  ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
  *pEVar4;
  ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
  *extraout_RAX;
  ulong uVar5;
  char *__buf;
  ulong uVar6;
  StringRef InputData;
  SmallString<16384U> Buffer;
  SmallVectorBase local_4040;
  char local_4030 [16384];
  
  local_4040.Size = 0;
  local_4040.Capacity = 0x4000;
  uVar5 = 0x4000;
  uVar6 = 0;
  local_4040.BeginX = local_4030;
  do {
    if (uVar5 < uVar6 + 0x4000) {
      llvm::SmallVectorBase::grow_pod(&local_4040,local_4030,uVar6 + 0x4000,1);
      uVar6 = local_4040._8_8_ & 0xffffffff;
    }
    __buf = (char *)((long)local_4040.BeginX + uVar6);
    piVar2 = __errno_location();
    while( true ) {
      *piVar2 = 0;
      sVar3 = read(FD,__buf,0x4000);
      if (sVar3 != -1) break;
      iVar1 = *piVar2;
      if (iVar1 != 4) {
        pEVar4 = (ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
                  *)std::_V2::generic_category();
        __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 | 1;
        *(int *)&__return_storage_ptr__->field_0 = iVar1;
        *(ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
          **)((long)&__return_storage_ptr__->field_0 + 8) = pEVar4;
        goto LAB_00177ebb;
      }
    }
    uVar5 = (ulong)local_4040.Capacity;
    uVar6 = (local_4040._8_8_ & 0xffffffff) + sVar3;
    if (uVar5 < uVar6) {
      __assert_fail("Size <= capacity()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
    }
    local_4040.Size = (int)uVar6;
  } while (sVar3 != 0);
  InputData.Length = uVar6;
  InputData.Data = (char *)local_4040.BeginX;
  pEVar4 = getMemBufferCopyImpl(__return_storage_ptr__,InputData,BufferName);
LAB_00177ebb:
  if ((char *)local_4040.BeginX != local_4030) {
    free(local_4040.BeginX);
    pEVar4 = extraout_RAX;
  }
  return pEVar4;
}

Assistant:

static ErrorOr<std::unique_ptr<WritableMemoryBuffer>>
getMemoryBufferForStream(int FD, const Twine &BufferName) {
  const ssize_t ChunkSize = 4096*4;
  SmallString<ChunkSize> Buffer;
  ssize_t ReadBytes;
  // Read into Buffer until we hit EOF.
  do {
    Buffer.reserve(Buffer.size() + ChunkSize);
    ReadBytes = sys::RetryAfterSignal(-1, ::read, FD, Buffer.end(), ChunkSize);
    if (ReadBytes == -1)
      return std::error_code(errno, std::generic_category());
    Buffer.set_size(Buffer.size() + ReadBytes);
  } while (ReadBytes != 0);

  return getMemBufferCopyImpl(Buffer, BufferName);
}